

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O3

void slider_knob_position(t_slider *x,_glist *glist,int val,int *x0,int *y0,int *x1,int *y1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  iVar2 = text_xpix((t_text *)x,glist);
  iVar3 = text_ypix((t_text *)x,glist);
  if (x->x_orientation == horizontal) {
    *x0 = iVar2 + val;
    *y0 = iVar1 + iVar3 + 1;
    *x1 = iVar2 + val;
    iVar3 = iVar3 + iVar1 * -2 + (x->x_gui).x_h;
  }
  else {
    iVar3 = (iVar3 - val) + (x->x_gui).x_h;
    *x0 = iVar1 + iVar2 + 1;
    *y0 = iVar3;
    *x1 = iVar2 + iVar1 * -2 + (x->x_gui).x_w;
  }
  *y1 = iVar3;
  return;
}

Assistant:

static void slider_knob_position(t_slider*x, t_glist *glist, int val, int *x0, int *y0, int *x1, int *y1)
{
    const int zoom = IEMGUI_ZOOM(x);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    if(x->x_orientation == horizontal)
    {
        int r = xpos + val;
        *x0 = r;
        *y0 = ypos + (zoom + 1);
        *x1 = r;
        *y1 = ypos + x->x_gui.x_h - (zoom * 2);
    } else {
        int r = ypos + x->x_gui.x_h - val;
        *x0 = xpos + (zoom + 1);
        *y0 = r;
        *x1 = xpos + x->x_gui.x_w - (zoom * 2);
        *y1 = r;
    }

}